

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall
TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment
          (TestOutput *this,SimpleString *file,size_t lineNumber)

{
  WorkingEnvironment WVar1;
  SimpleString *this_00;
  SimpleString local_40;
  SimpleString local_30;
  
  WVar1 = workingEnvironment_;
  if (workingEnvironment_ == detectEnvironment) {
    WVar1 = PlatformSpecificGetWorkingEnvironment();
  }
  if (WVar1 == visualStudio) {
    this_00 = &local_30;
    SimpleString::SimpleString(this_00,file);
    (*this->_vptr_TestOutput[0x15])(this,this_00,lineNumber);
  }
  else {
    this_00 = &local_40;
    SimpleString::SimpleString(this_00,file);
    (*this->_vptr_TestOutput[0x14])(this,this_00,lineNumber);
  }
  SimpleString::~SimpleString(this_00);
  return;
}

Assistant:

void TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment(SimpleString file, size_t lineNumber)
{
    if (TestOutput::getWorkingEnvironment() == TestOutput::visualStudio)
        printVisualStudioErrorInFileOnLine(file, lineNumber);
    else
        printEclipseErrorInFileOnLine(file, lineNumber);
}